

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O0

bool __thiscall tinyusdz::usdc::USDCReader::Impl::ReconstructStage(Impl *this,Stage *stage)

{
  bool bVar1;
  size_t sVar2;
  ostream *poVar3;
  vector<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_> *__x;
  vector<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_> *__x_00;
  vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_> *__x_01;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *pvVar4;
  map<tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>,_std::less<tinyusdz::crate::Index>,_std::allocator<std::pair<const_tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>_>_>
  *pmVar5;
  size_type sVar6;
  reference pvVar7;
  size_type sVar8;
  mapped_type *pmVar9;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *this_00;
  string local_550;
  ostringstream local_530 [8];
  ostringstream ss_e_1;
  bool ret;
  int root_node_id;
  ostringstream local_388 [8];
  ostringstream ss_e;
  ulong local_210;
  size_t i;
  PathIndexToSpecIndexMap path_index_to_spec_index_map;
  string local_1b8;
  ostringstream local_198 [8];
  ostringstream ss_w;
  Stage *stage_local;
  Impl *this_local;
  
  sVar2 = crate::CrateReader::NumNodes(this->crate_reader);
  if (sVar2 == 0) {
    ::std::__cxx11::ostringstream::ostringstream(local_198);
    poVar3 = ::std::operator<<((ostream *)local_198,"[warn]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"ReconstructStage");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xd9a);
    ::std::operator<<(poVar3," ");
    poVar3 = ::std::operator<<((ostream *)local_198,"Empty scene.");
    ::std::operator<<(poVar3,"\n");
    ::std::__cxx11::ostringstream::str();
    PushWarn(this,&local_1b8);
    ::std::__cxx11::string::~string((string *)&local_1b8);
    ::std::__cxx11::ostringstream::~ostringstream(local_198);
    this_local._7_1_ = true;
  }
  else {
    crate::CrateReader::GetNodes
              ((vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                *)&path_index_to_spec_index_map._M_h._M_single_bucket,this->crate_reader);
    ::std::
    vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
    ::operator=(&this->_nodes,
                (vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                 *)&path_index_to_spec_index_map._M_h._M_single_bucket);
    ::std::
    vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
    ::~vector((vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
               *)&path_index_to_spec_index_map._M_h._M_single_bucket);
    __x = crate::CrateReader::GetSpecs(this->crate_reader);
    ::std::vector<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>::operator=
              (&this->_specs,__x);
    __x_00 = crate::CrateReader::GetFields(this->crate_reader);
    ::std::vector<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>::operator=
              (&this->_fields,__x_00);
    __x_01 = crate::CrateReader::GetFieldsetIndices(this->crate_reader);
    ::std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>::operator=
              (&this->_fieldset_indices,__x_01);
    pvVar4 = crate::CrateReader::GetPaths(this->crate_reader);
    std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&this->_paths,
               (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)pvVar4);
    pvVar4 = crate::CrateReader::GetElemPaths(this->crate_reader);
    std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&this->_elemPaths,
               (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)pvVar4);
    pmVar5 = crate::CrateReader::GetLiveFieldSets_abi_cxx11_(this->crate_reader);
    ::std::
    map<tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>,_std::less<tinyusdz::crate::Index>,_std::allocator<std::pair<const_tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>_>_>
    ::operator=(&this->_live_fieldsets,pmVar5);
    ::std::
    unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
    ::unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                     *)&i);
    for (local_210 = 0;
        sVar6 = ::std::vector<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>::size
                          (&this->_specs), local_210 < sVar6; local_210 = local_210 + 1) {
      pvVar7 = ::std::vector<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>::
               operator[](&this->_specs,local_210);
      if ((pvVar7->path_index).value != 0xffffffff) {
        pvVar7 = ::std::vector<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>::
                 operator[](&this->_specs,local_210);
        sVar8 = ::std::
                unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                ::count((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                         *)&i,(key_type *)pvVar7);
        if (sVar8 != 0) {
          ::std::__cxx11::ostringstream::ostringstream(local_388);
          poVar3 = ::std::operator<<((ostream *)local_388,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ReconstructStage");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xdb2);
          ::std::operator<<(poVar3," ");
          poVar3 = ::std::operator<<((ostream *)local_388,"Multiple PathIndex found in Crate data.")
          ;
          ::std::operator<<(poVar3,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,(string *)&root_node_id);
          ::std::__cxx11::string::~string((string *)&root_node_id);
          this_local._7_1_ = false;
          ::std::__cxx11::ostringstream::~ostringstream(local_388);
          goto LAB_001e695f;
        }
        pvVar7 = ::std::vector<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>::
                 operator[](&this->_specs,local_210);
        pmVar9 = ::std::
                 unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::operator[]((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                               *)&i,(key_type *)pvVar7);
        *pmVar9 = (mapped_type)local_210;
      }
    }
    this_00 = Stage::root_prims(stage);
    ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::clear
              ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)this_00);
    bVar1 = ReconstructPrimRecursively(this,-1,0,(Prim *)0x0,0,(PathIndexToSpecIndexMap *)&i,stage);
    if (bVar1) {
      Stage::compute_absolute_prim_path_and_assign_prim_id(stage,true);
      this_local._7_1_ = true;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_530);
      poVar3 = ::std::operator<<((ostream *)local_530,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"ReconstructStage");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xdc4);
      ::std::operator<<(poVar3," ");
      poVar3 = ::std::operator<<((ostream *)local_530,"Failed to reconstruct Stage(Prim hierarchy)")
      ;
      ::std::operator<<(poVar3,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&local_550);
      ::std::__cxx11::string::~string((string *)&local_550);
      this_local._7_1_ = false;
      ::std::__cxx11::ostringstream::~ostringstream(local_530);
    }
LAB_001e695f:
    ::std::
    unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
    ::~unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                      *)&i);
  }
  return this_local._7_1_;
}

Assistant:

bool USDCReader::Impl::ReconstructStage(Stage *stage) {

  // format test
  DCOUT(fmt::format("# of Paths = {}", crate_reader->NumPaths()));

  if (crate_reader->NumNodes() == 0) {
    PUSH_WARN("Empty scene.");
    return true;
  }

  // TODO: Directly access data in crate_reader.
  _nodes = crate_reader->GetNodes();
  _specs = crate_reader->GetSpecs();
  _fields = crate_reader->GetFields();
  _fieldset_indices = crate_reader->GetFieldsetIndices();
  _paths = crate_reader->GetPaths();
  _elemPaths = crate_reader->GetElemPaths();
  _live_fieldsets = crate_reader->GetLiveFieldSets();

  PathIndexToSpecIndexMap
      path_index_to_spec_index_map;  // path_index -> spec_index

  {
    for (size_t i = 0; i < _specs.size(); i++) {
      if (_specs[i].path_index.value == ~0u) {
        continue;
      }

      // path_index should be unique.
      if (path_index_to_spec_index_map.count(_specs[i].path_index.value) != 0) {
        PUSH_ERROR_AND_RETURN("Multiple PathIndex found in Crate data.");
      }

      DCOUT(fmt::format("path index[{}] -> spec index [{}]",
                        _specs[i].path_index.value, uint32_t(i)));
      path_index_to_spec_index_map[_specs[i].path_index.value] = uint32_t(i);
    }
  }

  stage->root_prims().clear();

  int root_node_id = 0;
  bool ret = ReconstructPrimRecursively(/* no further root for root_node */ -1,
                                        root_node_id, /* root Prim */ nullptr,
                                        /* level */ 0,
                                        path_index_to_spec_index_map, stage);

  if (!ret) {
    PUSH_ERROR_AND_RETURN("Failed to reconstruct Stage(Prim hierarchy)");
  }

  stage->compute_absolute_prim_path_and_assign_prim_id();

  return true;
}